

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::BufferUniform::~BufferUniform(BufferUniform *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  (this->super_UniformInfo)._vptr_UniformInfo = (_func_int **)&PTR__BufferUniform_00d2dcd0;
  pSVar2 = (this->alloc).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->alloc).m_ptr = (Allocation *)0x0;
      (*((this->alloc).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->alloc).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->alloc).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->alloc).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->buffer).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->buffer).m_ptr = (Unique<vk::Handle<(vk::HandleType)8>_> *)0x0;
      (*((this->buffer).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->buffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->buffer).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->buffer).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

virtual						~BufferUniform	(void) {}